

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void __thiscall Date::add_month(Date *this,uint32_t n)

{
  int year;
  Month MVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  
  dVar4 = floor((double)n / 12.0);
  uVar2 = n % 0xc;
  if (0 < (int)dVar4) {
    add_year(this,(int)dVar4);
  }
  year = Date::year(this);
  days_in_months(year);
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    MVar1 = month(this);
    this->days = this->days + (long)*(int *)(&DAT_0011f6fc + (ulong)MVar1 * 4);
  }
  return;
}

Assistant:

void Date::add_month(uint32_t n)
{
	auto years_to_add = int(std::floor(n / 12.0));
	auto months_to_add = n % 12;
	if (years_to_add > 0)
		add_year(years_to_add);
	auto months = days_in_months(year());
	while (months_to_add > 0)
	{
		days += months[int(month()) - 1];
		--months_to_add;
	}
}